

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall t_php_generator::generate_service(t_php_generator *this,t_service *tservice)

{
  char *pcVar1;
  int __oflag;
  int __fd;
  allocator local_89;
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string f_service_name;
  t_service *tservice_local;
  t_php_generator *this_local;
  
  f_service_name.field_2._8_8_ = tservice;
  if ((this->classmap_ & 1U) != 0) {
    std::operator+(&local_58,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_58,".php");
    std::__cxx11::string::~string((string *)&local_58);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar1,&local_89);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_service_,(char *)local_88,__oflag);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    generate_service_header
              (this,(t_service *)f_service_name.field_2._8_8_,(ostream *)&this->f_service_);
    std::__cxx11::string::~string((string *)local_38);
  }
  generate_service_interface(this,(t_service *)f_service_name.field_2._8_8_);
  if ((this->rest_ & 1U) != 0) {
    generate_service_rest(this,(t_service *)f_service_name.field_2._8_8_);
  }
  generate_service_client(this,(t_service *)f_service_name.field_2._8_8_);
  generate_service_helpers(this,(t_service *)f_service_name.field_2._8_8_);
  if ((this->phps_ & 1U) != 0) {
    generate_service_processor(this,(t_service *)f_service_name.field_2._8_8_);
  }
  if ((this->classmap_ & 1U) != 0) {
    __fd = 0x56c218;
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (&this->f_service_,__fd);
  }
  return;
}

Assistant:

void t_php_generator::generate_service(t_service* tservice) {
  if(classmap_) {
    string f_service_name = package_dir_ + service_name_ + ".php";
    f_service_.open(f_service_name.c_str());
    generate_service_header(tservice, f_service_);
  }

  // Generate the three main parts of the service (well, two for now in PHP)
  generate_service_interface(tservice);
  if (rest_) {
    generate_service_rest(tservice);
  }
  generate_service_client(tservice);
  generate_service_helpers(tservice);
  if (phps_) {
    generate_service_processor(tservice);
  }

  if(classmap_) {
    // Close service file
    f_service_ << endl;
    f_service_.close();
  }
}